

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
fmt::BasicWriter<wchar_t>::write_int<long_long,fmt::FormatSpec>
          (BasicWriter<wchar_t> *this,longlong value,FormatSpec spec)

{
  undefined4 uVar1;
  lconv *plVar2;
  size_t sVar3;
  CharPtr pwVar4;
  CharPtr pwVar5;
  long lVar6;
  byte bVar7;
  char *pcVar8;
  ulong uVar9;
  wchar_t wVar10;
  uint uVar11;
  int iVar12;
  ulong uVar13;
  ulong uVar14;
  bool bVar15;
  char in_stack_ffffffffffffffbf;
  undefined4 in_stack_ffffffffffffffc0;
  uint uVar16;
  
  uVar1 = spec._20_4_;
  uVar16 = 0;
  if (value < 0) {
    uVar16 = 0x2d;
    value = -value;
LAB_0013da2e:
    uVar11 = 1;
  }
  else {
    uVar11 = 0;
    if (((undefined1  [24])spec & (undefined1  [24])0x100000000) != (undefined1  [24])0x0) {
      bVar7 = 0x2b;
      if (((undefined1  [24])spec & (undefined1  [24])0x200000000) == (undefined1  [24])0x0) {
        bVar7 = 0x20;
      }
      uVar16 = (uint)bVar7;
      goto LAB_0013da2e;
    }
  }
  spec._20_4_ = uVar1;
  if ((byte)spec.type_ < 100) {
    if ((byte)spec.type_ < 0x58) {
      if (spec.type_ == '\0') goto LAB_0013dd50;
      if (spec.type_ == 'B') {
LAB_0013dc62:
        uVar16 = uVar11;
        if (((undefined1  [24])spec & (undefined1  [24])0x800000000) != (undefined1  [24])0x0) {
          (&stack0xffffffffffffffc4)[uVar11] = 0x30;
          uVar16 = uVar11 | 2;
          (&stack0xffffffffffffffc5)[uVar11] = spec.type_;
        }
        uVar11 = 0;
        uVar9 = value;
        do {
          uVar11 = uVar11 + 1;
          bVar15 = 1 < uVar9;
          uVar9 = uVar9 >> 1;
        } while (bVar15);
        pwVar5 = prepare_int_buffer<fmt::FormatSpec>
                           (this,uVar11,&spec,&stack0xffffffffffffffc4,uVar16);
        do {
          *pwVar5 = (uint)value & 1 | 0x30;
          pwVar5 = pwVar5 + -1;
          bVar15 = 1 < (ulong)value;
          value = (ulong)value >> 1;
        } while (bVar15);
        return;
      }
    }
    else {
      if (spec.type_ == 'X') goto LAB_0013dcd5;
      if (spec.type_ == 'b') goto LAB_0013dc62;
    }
code_r0x0013ded0:
    internal::report_unknown_type
              (in_stack_ffffffffffffffbf,(char *)CONCAT44(uVar16,in_stack_ffffffffffffffc0));
  }
  if (0x6e < (byte)spec.type_) {
    if (spec.type_ == 'o') {
      if (((undefined1  [24])spec & (undefined1  [24])0x800000000) != (undefined1  [24])0x0) {
        uVar9 = (ulong)uVar11;
        uVar11 = uVar11 + 1;
        (&stack0xffffffffffffffc4)[uVar9] = 0x30;
      }
      uVar16 = 0;
      uVar9 = value;
      do {
        uVar16 = uVar16 + 1;
        bVar15 = 7 < uVar9;
        uVar9 = uVar9 >> 3;
      } while (bVar15);
      pwVar5 = prepare_int_buffer<fmt::FormatSpec>
                         (this,uVar16,&spec,&stack0xffffffffffffffc4,uVar11);
      do {
        *pwVar5 = (uint)value & 7 | 0x30;
        pwVar5 = pwVar5 + -1;
        bVar15 = 7 < (ulong)value;
        value = (ulong)value >> 3;
      } while (bVar15);
      return;
    }
    if (spec.type_ == 'x') {
LAB_0013dcd5:
      uVar16 = uVar11;
      if (((undefined1  [24])spec & (undefined1  [24])0x800000000) != (undefined1  [24])0x0) {
        (&stack0xffffffffffffffc4)[uVar11] = 0x30;
        uVar16 = uVar11 | 2;
        (&stack0xffffffffffffffc5)[uVar11] = spec.type_;
      }
      uVar11 = 0;
      uVar9 = value;
      do {
        uVar11 = uVar11 + 1;
        bVar15 = 0xf < uVar9;
        uVar9 = uVar9 >> 4;
      } while (bVar15);
      pwVar5 = prepare_int_buffer<fmt::FormatSpec>
                         (this,uVar11,&spec,&stack0xffffffffffffffc4,uVar16);
      pcVar8 = "0123456789ABCDEF";
      if (spec.type_ == 'x') {
        pcVar8 = "0123456789abcdef";
      }
      do {
        *pwVar5 = (int)pcVar8[(uint)value & 0xf];
        pwVar5 = pwVar5 + -1;
        bVar15 = 0xf < (ulong)value;
        value = (ulong)value >> 4;
      } while (bVar15);
      return;
    }
    goto code_r0x0013ded0;
  }
  if (spec.type_ == 'd') {
LAB_0013dd50:
    lVar6 = 0x3f;
    if ((value | 1U) != 0) {
      for (; (value | 1U) >> lVar6 == 0; lVar6 = lVar6 + -1) {
      }
    }
    uVar16 = ((uint)lVar6 ^ 0xffffffc0) * 0x4d1 + 0x13911 >> 0xc;
    pwVar5 = prepare_int_buffer<fmt::FormatSpec>
                       (this,(uVar16 - ((ulong)value <
                                       internal::BasicData<void>::POWERS_OF_10_64[uVar16])) + 1,
                        &spec,&stack0xffffffffffffffc4,uVar11);
    pwVar5 = pwVar5 + 1;
    uVar9 = value;
    if (99 < (ulong)value) {
      do {
        value = uVar9 / 100;
        uVar13 = (ulong)(uint)((int)uVar9 + (int)value * -100);
        pwVar5[-1] = (int)"00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
                          [uVar13 * 2 + 1];
        pwVar5[-2] = (int)"00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
                          [uVar13 * 2];
        pwVar5 = pwVar5 + -2;
        bVar15 = 9999 < uVar9;
        uVar9 = value;
      } while (bVar15);
    }
    if ((ulong)value < 10) {
      uVar16 = (uint)value | 0x30;
      lVar6 = -4;
    }
    else {
      pwVar5[-1] = (int)"00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
                        [((value & 0xffffffffU) * 2 & 0xffffffff) + 1];
      uVar16 = (uint)"00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
                     [(value & 0xffffffffU) * 2];
      lVar6 = -8;
    }
    *(uint *)((long)pwVar5 + lVar6) = uVar16;
    return;
  }
  if (spec.type_ != 'n') goto code_r0x0013ded0;
  lVar6 = 0x3f;
  if ((value | 1U) != 0) {
    for (; (value | 1U) >> lVar6 == 0; lVar6 = lVar6 + -1) {
    }
  }
  uVar16 = ((uint)lVar6 ^ 0xffffffc0) * 0x4d1 + 0x13911 >> 0xc;
  plVar2 = localeconv();
  pcVar8 = plVar2->thousands_sep;
  sVar3 = strlen(pcVar8);
  uVar16 = uVar16 - ((ulong)value < internal::BasicData<void>::POWERS_OF_10_64[uVar16]);
  pwVar4 = prepare_int_buffer<fmt::FormatSpec>
                     (this,uVar16 + (int)sVar3 * (uVar16 / 3) + 1,&spec,&stack0xffffffffffffffc4,
                      uVar11);
  pwVar5 = pwVar4 + 1;
  if ((ulong)value < 100) {
    if (9 < (ulong)value) {
      uVar9 = (ulong)(uint)((int)value * 2);
      *pwVar4 = (int)"00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
                     [uVar9 + 1];
      goto LAB_0013de9a;
    }
  }
  else {
    iVar12 = 0;
    do {
      uVar13 = value;
      value = uVar13 / 100;
      uVar9 = (ulong)(uint)(((int)uVar13 + (int)value * -100) * 2);
      pwVar5[-1] = (int)"00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
                        [uVar9 + 1];
      pwVar5 = pwVar5 + -1;
      if (iVar12 * -0x55555555 + 0xaaaaaaabU < 0x55555556) {
        pwVar5 = pwVar5 + -sVar3;
        if (0 < (long)sVar3) {
          lVar6 = 0;
          uVar14 = sVar3 + 1;
          do {
            pwVar5[lVar6] = (int)pcVar8[lVar6];
            uVar14 = uVar14 - 1;
            lVar6 = lVar6 + 1;
          } while (1 < uVar14);
          goto LAB_0013db7d;
        }
        pwVar5[-1] = (int)"00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
                          [uVar9];
        lVar6 = 0;
        if ((uint)((iVar12 + 2) * -0x55555555) < 0x55555556) {
          lVar6 = -sVar3;
        }
        pwVar5 = pwVar5 + lVar6 + -1;
      }
      else {
LAB_0013db7d:
        pwVar5[-1] = (int)"00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
                          [uVar9];
        pwVar5 = pwVar5 + -1;
        if (((uint)((iVar12 + 2) * -0x55555555) < 0x55555556) &&
           (pwVar5 = pwVar5 + -sVar3, 0 < (long)sVar3)) {
          lVar6 = 0;
          uVar9 = sVar3 + 1;
          do {
            pwVar5[lVar6] = (int)pcVar8[lVar6];
            uVar9 = uVar9 - 1;
            lVar6 = lVar6 + 1;
          } while (1 < uVar9);
        }
      }
      iVar12 = iVar12 + 2;
    } while (9999 < uVar13);
    if (999 < uVar13) {
      uVar9 = (ulong)(uint)((int)value * 2);
      pwVar4 = pwVar5 + -1;
      pwVar5[-1] = (int)"00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
                        [uVar9 + 1];
      if ((iVar12 * -0x55555555 + 0xaaaaaaabU < 0x55555556) &&
         (pwVar4 = pwVar4 + -sVar3, 0 < (long)sVar3)) {
        uVar13 = sVar3 + 1;
        lVar6 = 0;
        do {
          pwVar4[lVar6] = (int)pcVar8[lVar6];
          uVar13 = uVar13 - 1;
          lVar6 = lVar6 + 1;
        } while (1 < uVar13);
      }
LAB_0013de9a:
      wVar10 = (wchar_t)"00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
                        [uVar9];
      goto LAB_0013dea7;
    }
  }
  pwVar4 = pwVar5;
  wVar10 = (uint)value | 0x30;
LAB_0013dea7:
  pwVar4[-1] = wVar10;
  return;
}

Assistant:

void BasicWriter<Char>::write_int(T value, Spec spec) {
  unsigned prefix_size = 0;
  typedef typename internal::IntTraits<T>::MainType UnsignedType;
  UnsignedType abs_value = static_cast<UnsignedType>(value);
  char prefix[4] = "";
  if (internal::is_negative(value)) {
    prefix[0] = '-';
    ++prefix_size;
    abs_value = 0 - abs_value;
  } else if (spec.flag(SIGN_FLAG)) {
    prefix[0] = spec.flag(PLUS_FLAG) ? '+' : ' ';
    ++prefix_size;
  }
  switch (spec.type()) {
  case 0: case 'd': {
    unsigned num_digits = internal::count_digits(abs_value);
    CharPtr p = prepare_int_buffer(num_digits, spec, prefix, prefix_size) + 1;
    internal::format_decimal(get(p), abs_value, 0);
    break;
  }
  case 'x': case 'X': {
    UnsignedType n = abs_value;
    if (spec.flag(HASH_FLAG)) {
      prefix[prefix_size++] = '0';
      prefix[prefix_size++] = spec.type();
    }
    unsigned num_digits = 0;
    do {
      ++num_digits;
    } while ((n >>= 4) != 0);
    Char *p = get(prepare_int_buffer(
      num_digits, spec, prefix, prefix_size));
    n = abs_value;
    const char *digits = spec.type() == 'x' ?
        "0123456789abcdef" : "0123456789ABCDEF";
    do {
      *p-- = digits[n & 0xf];
    } while ((n >>= 4) != 0);
    break;
  }
  case 'b': case 'B': {
    UnsignedType n = abs_value;
    if (spec.flag(HASH_FLAG)) {
      prefix[prefix_size++] = '0';
      prefix[prefix_size++] = spec.type();
    }
    unsigned num_digits = 0;
    do {
      ++num_digits;
    } while ((n >>= 1) != 0);
    Char *p = get(prepare_int_buffer(num_digits, spec, prefix, prefix_size));
    n = abs_value;
    do {
      *p-- = static_cast<Char>('0' + (n & 1));
    } while ((n >>= 1) != 0);
    break;
  }
  case 'o': {
    UnsignedType n = abs_value;
    if (spec.flag(HASH_FLAG))
      prefix[prefix_size++] = '0';
    unsigned num_digits = 0;
    do {
      ++num_digits;
    } while ((n >>= 3) != 0);
    Char *p = get(prepare_int_buffer(num_digits, spec, prefix, prefix_size));
    n = abs_value;
    do {
      *p-- = static_cast<Char>('0' + (n & 7));
    } while ((n >>= 3) != 0);
    break;
  }
  case 'n': {
    unsigned num_digits = internal::count_digits(abs_value);
    fmt::StringRef sep = "";
#ifndef ANDROID
    sep = internal::thousands_sep(std::localeconv());
#endif
    unsigned size = static_cast<unsigned>(
          num_digits + sep.size() * ((num_digits - 1) / 3));
    CharPtr p = prepare_int_buffer(size, spec, prefix, prefix_size) + 1;
    internal::format_decimal(get(p), abs_value, 0, internal::ThousandsSep(sep));
    break;
  }
  default:
    internal::report_unknown_type(
      spec.type(), spec.flag(CHAR_FLAG) ? "char" : "integer");
    break;
  }
}